

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snp_vs_vcf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char cVar2;
  char cVar3;
  _Alloc_hider _Var4;
  pointer piVar5;
  pointer pbVar6;
  size_t sVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  mapped_type *pmVar11;
  ostream *poVar12;
  istream *piVar13;
  ulong uVar14;
  __normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_> _Var15;
  long lVar16;
  undefined7 extraout_var;
  size_type sVar17;
  undefined7 extraout_var_00;
  int *piVar18;
  pointer pcVar19;
  pointer pbVar20;
  ulong uVar21;
  size_type sVar22;
  long lVar23;
  pointer pcVar24;
  string *psVar25;
  int iVar26;
  uint64_t i;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  vector<call,_std::allocator<call>_> calls_vcf;
  int pos;
  undefined4 uStack_cac;
  size_type local_ca8;
  undefined1 local_ca0 [20];
  int local_c8c;
  double local_c88;
  double dStack_c80;
  string left_context;
  string right_context_1;
  long local_c38;
  string ALT;
  string right_context;
  string line;
  long local_bb8;
  vector<int,_std::allocator<int>_> assigned;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ref;
  vector<call,_std::allocator<call>_> found_calls_vcf;
  string local_b48 [32];
  char local_b28;
  char local_b27;
  uint64_t local_b20;
  bool local_b18;
  int local_b14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contigs;
  string left_context2;
  string left_context1;
  string right_context2;
  string right_context1;
  string h2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  left_contexts;
  string contig;
  string local_a08;
  set<int,_std::less<int>,_std::allocator<int>_> found;
  set<int,_std::less<int>,_std::allocator<int>_> found_nonisolated;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  ifstream vcf_file;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_638;
  byte abStack_628 [488];
  ifstream calls_file;
  undefined4 uStack_43c;
  byte abStack_420 [488];
  ifstream ref_file;
  byte abStack_218 [488];
  
  if (argc < 4) {
switchD_00106934_caseD_64:
    help();
LAB_00108006:
    std::operator<<((ostream *)&std::cout,
                    "Error: malformed SNP file. Two reads with different length in a SNP:\n");
    poVar12 = std::operator<<((ostream *)&std::cout,(string *)&ALT);
    poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(poVar12,(string *)&left_context);
    poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(poVar12,(string *)&h2);
    poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
    poVar12 = std::operator<<(poVar12,(string *)&pos);
    std::endl<char,std::char_traits<char>>(poVar12);
    exit(1);
  }
LAB_00106918:
  iVar10 = getopt(argc,argv,"hv:c:f:l:k:");
  switch(iVar10) {
  case 99:
    std::__cxx11::string::string((string *)&ref_file,_optarg,(allocator *)&vcf_file);
    psVar25 = &calls_path_abi_cxx11_;
    break;
  case 100:
  case 0x65:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
    goto switchD_00106934_caseD_64;
  case 0x66:
    std::__cxx11::string::string((string *)&ref_file,_optarg,(allocator *)&vcf_file);
    psVar25 = &ref_path_abi_cxx11_;
    break;
  case 0x6b:
    k_nonis = atoi(_optarg);
    goto LAB_00106918;
  case 0x6c:
    goto switchD_00106934_caseD_6c;
  default:
    if (iVar10 != 0x76) {
      if (iVar10 == -1) {
        if (rlength == 0) {
          rlength = rlength_def;
        }
        if (k_nonis == 0) {
          k_nonis = k_nonis_def;
        }
        iVar10 = std::__cxx11::string::compare((char *)&vcf_path_abi_cxx11_);
        if (((iVar10 != 0) &&
            (iVar10 = std::__cxx11::string::compare((char *)&calls_path_abi_cxx11_), iVar10 != 0))
           && (iVar10 = std::__cxx11::string::compare((char *)&ref_path_abi_cxx11_), iVar10 != 0)) {
          ref._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &ref._M_t._M_impl.super__Rb_tree_header._M_header;
          ref._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          ref._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          ref._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          ref._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               ref._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::operator<<((ostream *)&std::cout,"Loading reference ... ");
          std::ostream::flush();
          std::ifstream::ifstream(&ref_file);
          std::ifstream::open((string *)&ref_file,0x10d208);
          line._M_dataplus._M_p = (pointer)&line.field_2;
          line._M_string_length = 0;
          contig._M_dataplus._M_p = (pointer)&contig.field_2;
          contig._M_string_length = 0;
          line.field_2._M_local_buf[0] = '\0';
          contig.field_2._M_local_buf[0] = '\0';
          contigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          contigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          contigs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          while ((abStack_218[*(long *)(_ref_file + -0x18)] & 2) == 0) {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&ref_file,(string *)&line);
            sVar17 = line._M_string_length;
            _Var4 = line._M_dataplus;
            if (*line._M_dataplus._M_p == '>') {
              std::__cxx11::string::substr((ulong)&vcf_file,(ulong)&line);
              std::__cxx11::string::operator=((string *)&contig,(string *)&vcf_file);
              std::__cxx11::string::~string((string *)&vcf_file);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&contigs,&contig);
              _vcf_file = (pointer)&local_638;
              local_638._M_local_buf[0] = '\0';
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&ref,&contig);
              std::__cxx11::string::operator=((string *)pmVar11,(string *)&vcf_file);
              std::__cxx11::string::~string((string *)&vcf_file);
            }
            else {
              for (sVar22 = 0; sVar17 != sVar22; sVar22 = sVar22 + 1) {
                iVar10 = toupper((int)_Var4._M_p[sVar22]);
                _Var4._M_p[sVar22] = (char)iVar10;
              }
              pmVar11 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&ref,&contig);
              std::__cxx11::string::append((string *)pmVar11);
            }
          }
          poVar12 = std::operator<<((ostream *)&std::cout,"done.");
          std::endl<char,std::char_traits<char>>(poVar12);
          poVar12 = std::operator<<((ostream *)&std::cout,"Contig\tlength");
          std::endl<char,std::char_traits<char>>(poVar12);
          pbVar6 = contigs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_c38 = 0;
          for (pbVar20 = contigs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar6;
              pbVar20 = pbVar20 + 1) {
            std::__cxx11::string::string((string *)&vcf_file,(string *)pbVar20);
            poVar12 = std::operator<<((ostream *)&std::cout,(string *)&vcf_file);
            poVar12 = std::operator<<(poVar12,"\t");
            std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&ref,(key_type *)&vcf_file);
            poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
            std::endl<char,std::char_traits<char>>(poVar12);
            pmVar11 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&ref,(key_type *)&vcf_file);
            local_c38 = local_c38 + pmVar11->_M_string_length;
            std::__cxx11::string::~string((string *)&vcf_file);
          }
          std::ifstream::close();
          std::operator<<((ostream *)&std::cout,"Loading VCF ... ");
          std::ostream::flush();
          std::ifstream::ifstream(&vcf_file);
          std::ifstream::open((string *)&vcf_file,0x10d1c8);
          calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)0x0;
          calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_finish = (pointer)0x0;
          calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (pointer)0x0;
          local_c88 = 0.0;
          local_bb8 = 0;
          while ((abStack_628[*(long *)(_vcf_file + -0x18)] & 2) == 0) {
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&vcf_file,(string *)&line);
            if ((line._M_string_length != 0) && (*line._M_dataplus._M_p != '#')) {
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)&calls_file,(string *)&line,_S_in);
              found_nonisolated._M_t._M_impl._0_8_ =
                   &found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)&found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage;
              found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              right_context._M_dataplus._M_p = (pointer)&right_context.field_2;
              right_context._M_string_length = 0;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)
                   ((ulong)found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                   & 0xffffffffffffff00);
              found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage &
                            0xffffffffffffff00);
              right_context.field_2._M_local_buf[0] = '\0';
              ALT._M_dataplus._M_p = (pointer)&ALT.field_2;
              ALT._M_string_length = 0;
              ALT.field_2._M_local_buf[0] = '\0';
              piVar13 = std::operator>>((istream *)&calls_file,(string *)&found_nonisolated);
              piVar13 = (istream *)std::istream::operator>>(piVar13,&pos);
              piVar13 = std::operator>>(piVar13,(string *)&found_calls_vcf);
              piVar13 = std::operator>>(piVar13,(string *)&right_context);
              std::operator>>(piVar13,(string *)&ALT);
              _pos = (undefined1 *)CONCAT44(uStack_cac,pos + -1);
              iVar10 = std::__cxx11::string::compare((char *)&right_context);
              if (((iVar10 == 0) ||
                  ((iVar10 = std::__cxx11::string::compare((char *)&right_context), iVar10 == 0 ||
                   (iVar10 = std::__cxx11::string::compare((char *)&right_context), iVar10 == 0))))
                 || (iVar10 = std::__cxx11::string::compare((char *)&right_context), iVar10 == 0)) {
                iVar10 = std::__cxx11::string::compare((char *)&ALT);
                if ((((iVar10 == 0) ||
                     (iVar10 = std::__cxx11::string::compare((char *)&ALT), iVar10 == 0)) ||
                    (iVar10 = std::__cxx11::string::compare((char *)&ALT), iVar10 == 0)) ||
                   (iVar10 = std::__cxx11::string::compare((char *)&ALT), iVar10 == 0)) {
                  pmVar11 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator[](&ref,(key_type *)&found_nonisolated);
                  iVar10 = std::__cxx11::string::compare((char *)pmVar11);
                  if (iVar10 == 0) {
                    poVar12 = std::operator<<((ostream *)&std::cout,"WARNING: chromosome ");
                    poVar12 = std::operator<<(poVar12,(string *)&found_nonisolated);
                    poVar12 = std::operator<<(poVar12," not found. ");
                    std::endl<char,std::char_traits<char>>(poVar12);
                  }
                  else {
                    uVar21 = (ulong)pos;
                    pmVar11 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::operator[](&ref,(key_type *)&found_nonisolated);
                    if (pmVar11->_M_string_length <= uVar21) {
                      poVar12 = std::operator<<((ostream *)&std::cout,"WARNING: position ");
                      poVar12 = (ostream *)std::ostream::operator<<(poVar12,pos);
                      poVar12 = std::operator<<(poVar12," larger than chromosome ");
                      poVar12 = std::operator<<(poVar12,(string *)&found_nonisolated);
                      poVar12 = std::operator<<(poVar12,"\'s length ");
                      std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&ref,(key_type *)&found_nonisolated);
                      poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                      std::endl<char,std::char_traits<char>>(poVar12);
                    }
                    iVar10 = rlength;
                    iVar26 = pos;
                    if ((rlength <= pos) &&
                       (pmVar11 = std::
                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ::operator[](&ref,(key_type *)&found_nonisolated),
                       (ulong)(long)(iVar10 + iVar26) < pmVar11->_M_string_length)) {
                      pmVar11 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[](&ref,(key_type *)&found_nonisolated);
                      std::__cxx11::string::substr((ulong)&right_context_1,(ulong)pmVar11);
                      pmVar11 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[](&ref,(key_type *)&found_nonisolated);
                      std::__cxx11::string::substr((ulong)&local_668,(ulong)pmVar11);
                      REV(&left_context,&local_668);
                      std::__cxx11::string::~string((string *)&local_668);
                      std::__cxx11::string::string((string *)&found,(string *)&right_context_1);
                      std::__cxx11::string::string
                                ((string *)
                                 &found._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                                 (string *)&left_context);
                      std::vector<call,_std::allocator<call>_>::emplace_back<call>
                                (&calls_vcf,(call *)&found);
                      call::~call((call *)&found);
                      pmVar11 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[](&ref,(key_type *)&found_nonisolated);
                      std::__cxx11::string::substr((ulong)&local_a08,(ulong)pmVar11);
                      RC(&local_688,&local_a08);
                      REV((string *)&found,&local_688);
                      std::__cxx11::string::operator=((string *)&left_context,(string *)&found);
                      std::__cxx11::string::~string((string *)&found);
                      std::__cxx11::string::~string((string *)&local_688);
                      std::__cxx11::string::~string((string *)&local_a08);
                      pmVar11 = std::
                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator[](&ref,(key_type *)&found_nonisolated);
                      std::__cxx11::string::substr((ulong)&local_6a8,(ulong)pmVar11);
                      RC((string *)&found,&local_6a8);
                      std::__cxx11::string::operator=((string *)&right_context_1,(string *)&found);
                      std::__cxx11::string::~string((string *)&found);
                      std::__cxx11::string::~string((string *)&local_6a8);
                      std::__cxx11::string::string((string *)&found,(string *)&right_context_1);
                      std::__cxx11::string::string
                                ((string *)
                                 &found._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
                                 (string *)&left_context);
                      RC(*right_context._M_dataplus._M_p);
                      RC(*ALT._M_dataplus._M_p);
                      std::vector<call,_std::allocator<call>_>::emplace_back<call>
                                (&calls_vcf,(call *)&found);
                      call::~call((call *)&found);
                      std::__cxx11::string::~string((string *)&left_context);
                      std::__cxx11::string::~string((string *)&right_context_1);
                    }
                    local_bb8 = local_bb8 + 1;
                    local_c88 = (double)((long)local_c88 + 1);
                  }
                }
              }
              std::__cxx11::string::~string((string *)&ALT);
              std::__cxx11::string::~string((string *)&right_context);
              std::__cxx11::string::~string((string *)&found_calls_vcf);
              std::__cxx11::string::~string((string *)&found_nonisolated);
              std::__cxx11::istringstream::~istringstream((istringstream *)&calls_file);
            }
          }
          if (calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_start) {
            poVar12 = std::operator<<((ostream *)&std::cout,
                                      "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. "
                                     );
            std::endl<char,std::char_traits<char>>(poVar12);
          }
          iVar10 = k_nonis;
          uVar14 = ((long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x58;
          piVar18 = &calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                     super__Vector_impl_data._M_start[4].pos;
          local_c8c = 0;
          iVar26 = 0;
          for (uVar21 = 2; (iVar8 = local_c8c, 1 < uVar14 && (iVar8 = iVar26, uVar21 < uVar14 - 2));
              uVar21 = uVar21 + 1) {
            if ((uVar21 & 1) == 0) {
              if (piVar18[-0x2c] - piVar18[-0x58] < iVar10) {
                bVar9 = false;
              }
              else {
                bVar9 = iVar10 <= *piVar18 - piVar18[-0x2c];
              }
              *(bool *)(piVar18 + -0x2d) = bVar9;
              *(bool *)(piVar18 + -0x17) = bVar9;
              iVar26 = iVar26 + (uint)(bVar9 ^ 1);
            }
            piVar18 = piVar18 + 0x16;
          }
          local_c8c = iVar8;
          poVar12 = std::operator<<((ostream *)&std::cout,"done.");
          std::endl<char,std::char_traits<char>>(poVar12);
          std::operator<<((ostream *)&std::cout,"Sorting VCF by context ... ");
          std::ostream::flush();
          std::
          __sort<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(call_const&,call_const&)>>
                    ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)
                     calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>)
                     calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     (_Iter_comp_iter<bool_(*)(const_call_&,_const_call_&)>)0x1068d1);
          poVar12 = std::operator<<((ostream *)&std::cout,"done.");
          std::endl<char,std::char_traits<char>>(poVar12);
          std::ifstream::close();
          std::operator<<((ostream *)&std::cout,"Checking calls ... ");
          std::ostream::flush();
          _calls_file = 0;
          std::vector<int,_std::allocator<int>_>::vector
                    (&assigned,
                     ((long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x58,
                     (value_type_conflict1 *)&calls_file,(allocator_type *)&found);
          std::ifstream::ifstream(&calls_file);
          std::ifstream::open((string *)&calls_file,0x10d1e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&left_contexts,2,(allocator_type *)&found);
          right_context._M_dataplus._M_p = (pointer)&right_context.field_2;
          right_context._M_string_length = 0;
          right_context.field_2._M_local_buf[0] = '\0';
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&calls_file,(string *)&line);
          lVar27 = 0;
          lVar23 = 0;
          do {
            if ((abStack_420[*(long *)(CONCAT44(uStack_43c,_calls_file) + -0x18)] & 2) != 0) {
              poVar12 = std::operator<<((ostream *)&std::cout,"done.");
              std::endl<char,std::char_traits<char>>(poVar12);
              std::ifstream::close();
              found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              found_calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              found._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &found._M_t._M_impl.super__Rb_tree_header._M_header;
              found._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              found._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              found._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              lVar16 = 0x12;
              found._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   found._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              for (uVar21 = 0;
                  uVar21 < (ulong)(((long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>.
                                         _M_impl.super__Vector_impl_data._M_start) / 0x58);
                  uVar21 = uVar21 + 1) {
                if (assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar21] != 0) {
                  found_nonisolated._M_t._M_impl._0_4_ =
                       *(undefined4 *)
                        ((long)&((calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                  super__Vector_impl_data._M_start)->right_context)._M_dataplus._M_p
                        + lVar16 * 4);
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::_M_insert_unique<int>(&found._M_t,(int *)&found_nonisolated);
                }
                lVar16 = lVar16 + 0x16;
              }
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                   found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                   0xffffffff00000000;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              lVar16 = 0x14;
              pcVar19 = calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pcVar24 = calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              for (uVar21 = 0; sVar7 = found._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  uVar21 < (ulong)(((long)pcVar24 - (long)pcVar19) / 0x58); uVar21 = uVar21 + 1) {
                if ((assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar21] != 0) &&
                   (*(char *)((long)&(pcVar19->right_context)._M_dataplus._M_p + lVar16 * 4) == '\0'
                   )) {
                  ALT._M_dataplus._M_p._0_4_ = *(undefined4 *)((long)pcVar19 + lVar16 * 4 + -8);
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::_M_insert_unique<int>(&found_nonisolated._M_t,(int *)&ALT);
                  pcVar19 = calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pcVar24 = calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                }
                lVar16 = lVar16 + 0x16;
              }
              poVar12 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              poVar12 = std::operator<<(poVar12,"Non-isolated SNPs detected: ");
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
              poVar12 = std::operator<<(poVar12,"/");
              poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_c8c);
              std::endl<char,std::char_traits<char>>(poVar12);
              std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              poVar12 = std::operator<<((ostream *)&std::cout,"TP = ");
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
              std::endl<char,std::char_traits<char>>(poVar12);
              poVar12 = std::operator<<((ostream *)&std::cout,"TN = ");
              local_bb8 = local_bb8 - sVar7;
              local_c38 = local_c38 - (lVar23 + local_bb8);
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
              std::endl<char,std::char_traits<char>>(poVar12);
              poVar12 = std::operator<<((ostream *)&std::cout,"FP = ");
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
              std::endl<char,std::char_traits<char>>(poVar12);
              poVar12 = std::operator<<((ostream *)&std::cout,"FN = ");
              poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
              std::endl<char,std::char_traits<char>>(poVar12);
              std::operator<<((ostream *)&std::cout,"sensitivity = TP/(TP+FN) = ");
              auVar28._8_4_ = (int)(sVar7 >> 0x20);
              auVar28._0_8_ = sVar7;
              auVar28._12_4_ = 0x45300000;
              dStack_c80 = auVar28._8_8_ - 1.9342813113834067e+25;
              local_c88 = dStack_c80 +
                          ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0);
              dVar33 = local_c88 * 100.0;
              auVar29._8_4_ = (int)((ulong)local_bb8 >> 0x20);
              auVar29._0_8_ = local_bb8;
              auVar29._12_4_ = 0x45300000;
              poVar12 = std::ostream::_M_insert<double>
                                  (dVar33 / ((auVar29._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,(int)local_bb8) -
                                             4503599627370496.0) + local_c88));
              poVar12 = std::operator<<(poVar12,"%");
              std::endl<char,std::char_traits<char>>(poVar12);
              std::operator<<((ostream *)&std::cout,"specificity = TN/(TN+FP) = ");
              auVar30._8_4_ = (int)((ulong)local_c38 >> 0x20);
              auVar30._0_8_ = local_c38;
              auVar30._12_4_ = 0x45300000;
              dVar31 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)local_c38) - 4503599627370496.0);
              auVar32._8_4_ = (int)((ulong)lVar27 >> 0x20);
              auVar32._0_8_ = lVar27;
              auVar32._12_4_ = 0x45300000;
              dVar34 = (auVar32._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar27) - 4503599627370496.0);
              poVar12 = std::ostream::_M_insert<double>((dVar31 * 100.0) / (dVar31 + dVar34));
              poVar12 = std::operator<<(poVar12,"%");
              std::endl<char,std::char_traits<char>>(poVar12);
              std::operator<<((ostream *)&std::cout,"precision   = TP/(TP+FP) = ");
              poVar12 = std::ostream::_M_insert<double>(dVar33 / (local_c88 + dVar34));
              poVar12 = std::operator<<(poVar12,"%");
              std::endl<char,std::char_traits<char>>(poVar12);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree(&found_nonisolated._M_t);
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree(&found._M_t);
              std::vector<call,_std::allocator<call>_>::~vector(&found_calls_vcf);
              std::__cxx11::string::~string((string *)&right_context);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&left_contexts);
              std::ifstream::~ifstream(&calls_file);
              std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                        (&assigned.super__Vector_base<int,_std::allocator<int>_>);
              std::vector<call,_std::allocator<call>_>::~vector(&calls_vcf);
              std::ifstream::~ifstream(&vcf_file);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&contigs);
              std::__cxx11::string::~string((string *)&contig);
              std::__cxx11::string::~string((string *)&line);
              std::ifstream::~ifstream(&ref_file);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~_Rb_tree(&ref._M_t);
              return 0;
            }
            std::__cxx11::string::string((string *)&ALT,(string *)&line);
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&found,(string *)&line,_S_in);
            right_context_1._M_dataplus._M_p = (pointer)&right_context_1.field_2;
            right_context_1._M_string_length = 0;
            right_context_1.field_2._M_local_buf[0] = '\0';
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&found,(string *)&right_context_1,'|');
            std::__cxx11::string::substr((ulong)&found_nonisolated,(ulong)&right_context_1);
            iVar10 = std::__cxx11::string::compare((char *)&found_nonisolated);
            std::__cxx11::string::~string((string *)&found_nonisolated);
            if (iVar10 == 0) {
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&found,(string *)&right_context_1,'|');
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)&found_nonisolated,(string *)&right_context_1,_S_in);
              std::__cxx11::istringstream::operator=
                        ((istringstream *)&found,(istringstream *)&found_nonisolated);
              std::__cxx11::istringstream::~istringstream((istringstream *)&found_nonisolated);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&found,(string *)&right_context_1,':');
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&found,(string *)&right_context_1,':');
              std::__cxx11::istringstream::istringstream
                        ((istringstream *)&found_nonisolated,(string *)&right_context_1,_S_in);
              std::__cxx11::istringstream::operator=
                        ((istringstream *)&found,(istringstream *)&found_nonisolated);
              std::__cxx11::istringstream::~istringstream((istringstream *)&found_nonisolated);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&found,(string *)&right_context_1,'_');
              left_context._M_dataplus._M_p = (pointer)&left_context.field_2;
              left_context._M_string_length = 0;
              left_context.field_2._M_local_buf[0] = '\0';
              _pos = local_ca0;
              local_ca8 = 0;
              local_ca0[0] = 0;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&calls_file,(string *)&left_context);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&calls_file,(string *)&pos);
              std::__cxx11::string::string((string *)&h2,(string *)&pos);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&calls_file,(string *)&pos);
              if (left_context._M_string_length != local_ca8) goto LAB_00108006;
              sVar17 = left_context._M_string_length;
              for (uVar21 = 0; uVar21 < sVar17; uVar21 = uVar21 + 1) {
                uVar14 = ~uVar21;
                if (left_context._M_dataplus._M_p[uVar14 + sVar17] != _pos[uVar14 + local_ca8]) {
                  std::__cxx11::string::substr((ulong)&right_context1,(ulong)&left_context);
                  std::__cxx11::string::substr((ulong)&right_context2,(ulong)&pos);
                  std::__cxx11::string::substr((ulong)&local_6c8,(ulong)&left_context);
                  REV(&left_context1,&local_6c8);
                  std::__cxx11::string::~string((string *)&local_6c8);
                  std::__cxx11::string::substr((ulong)&local_6e8,(ulong)&pos);
                  REV(&left_context2,&local_6e8);
                  std::__cxx11::string::~string((string *)&local_6e8);
                  cVar1 = left_context._M_dataplus._M_p[uVar14 + left_context._M_string_length];
                  cVar2 = _pos[uVar14 + local_ca8];
                  std::__cxx11::string::string
                            ((string *)&found_nonisolated,(string *)&right_context1);
                  std::__cxx11::string::string
                            ((string *)
                             &found_nonisolated._M_t._M_impl.super__Rb_tree_header._M_header.
                              _M_right,(string *)&left_context1);
                  std::__cxx11::string::string((string *)&found_calls_vcf,(string *)&right_context2)
                  ;
                  std::__cxx11::string::string(local_b48,(string *)&left_context2);
                  local_b20 = 0;
                  local_b18 = false;
                  local_b14 = 0;
                  local_b28 = cVar1;
                  local_b27 = cVar2;
                  _Var15 = std::
                           __lower_bound<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,call,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(call_const&,call_const&)>>
                                     ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>
                                       )calls_vcf.super__Vector_base<call,_std::allocator<call>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                      (__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>
                                       )calls_vcf.super__Vector_base<call,_std::allocator<call>_>.
                                        _M_impl.super__Vector_impl_data._M_finish,
                                      (call *)&found_nonisolated,
                                      (_Iter_comp_val<bool_(*)(const_call_&,_const_call_&)>)0x1068d1
                                     );
                  piVar5 = assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pcVar24 = calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  pcVar19 = calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  lVar23 = lVar23 + 1;
                  uVar14 = ((long)_Var15._M_current -
                           (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_start) / 0x58;
                  lVar16 = (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                                 super__Vector_impl_data._M_start;
                  psVar25 = &calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar14].left_context;
                  local_c88 = (double)((ulong)local_c88 & 0xffffffff00000000);
                  while ((uVar14 < (ulong)(lVar16 / 0x58) &&
                         (bVar9 = is_prefix(&right_context1,psVar25 + -1), bVar9))) {
                    cVar3 = *(char *)((long)&psVar25[1]._M_dataplus._M_p + 1);
                    if ((((cVar3 == cVar2) && (*(char *)&psVar25[1]._M_dataplus._M_p == cVar1)) ||
                        ((cVar3 == cVar1 && (*(char *)&psVar25[1]._M_dataplus._M_p == cVar2)))) &&
                       (bVar9 = is_prefix(&left_context1,psVar25), bVar9)) {
                      piVar5[uVar14] = 1;
                      local_c88 = (double)CONCAT44(local_c88._4_4_,(int)CONCAT71(extraout_var,1));
                    }
                    uVar14 = uVar14 + 1;
                    psVar25 = (string *)((long)&psVar25[2].field_2 + 8);
                  }
                  if (((ulong)local_c88 & 1) == 0) {
                    _Var15 = std::
                             __lower_bound<__gnu_cxx::__normal_iterator<call*,std::vector<call,std::allocator<call>>>,call,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(call_const&,call_const&)>>
                                       ((__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>
                                         )pcVar19,
                                        (__normal_iterator<call_*,_std::vector<call,_std::allocator<call>_>_>
                                         )pcVar24,(call *)&found_calls_vcf,
                                        (_Iter_comp_val<bool_(*)(const_call_&,_const_call_&)>)
                                        0x1068d1);
                    piVar5 = assigned.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
                    uVar14 = ((long)_Var15._M_current -
                             (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl
                                   .super__Vector_impl_data._M_start) / 0x58;
                    lVar16 = (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                             (long)calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl
                                   .super__Vector_impl_data._M_start;
                    psVar25 = &calls_vcf.super__Vector_base<call,_std::allocator<call>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar14].left_context;
                    while ((uVar14 < (ulong)(lVar16 / 0x58) &&
                           (bVar9 = is_prefix(&right_context2,psVar25 + -1), bVar9))) {
                      cVar3 = *(char *)((long)&psVar25[1]._M_dataplus._M_p + 1);
                      if ((((cVar3 == cVar2) && (*(char *)&psVar25[1]._M_dataplus._M_p == cVar1)) ||
                          ((cVar3 == cVar1 && (*(char *)&psVar25[1]._M_dataplus._M_p == cVar2)))) &&
                         (bVar9 = is_prefix(&left_context2,psVar25), bVar9)) {
                        piVar5[uVar14] = 1;
                        local_c88 = (double)CONCAT44(local_c88._4_4_,
                                                     (int)CONCAT71(extraout_var_00,1));
                      }
                      uVar14 = uVar14 + 1;
                      psVar25 = (string *)((long)&psVar25[2].field_2 + 8);
                    }
                  }
                  lVar27 = lVar27 + (ulong)(~SUB81(local_c88,0) & 1);
                  call::~call((call *)&found_calls_vcf);
                  call::~call((call *)&found_nonisolated);
                  std::__cxx11::string::~string((string *)&left_context2);
                  std::__cxx11::string::~string((string *)&left_context1);
                  std::__cxx11::string::~string((string *)&right_context2);
                  std::__cxx11::string::~string((string *)&right_context1);
                  sVar17 = left_context._M_string_length;
                }
              }
              std::__cxx11::string::~string((string *)&h2);
              std::__cxx11::string::~string((string *)&pos);
              std::__cxx11::string::~string((string *)&left_context);
            }
            else {
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&calls_file,(string *)&line);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&calls_file,(string *)&line);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&calls_file,(string *)&line);
            }
            std::getline<char,std::char_traits<char>,std::allocator<char>>
                      ((istream *)&calls_file,(string *)&line);
            std::__cxx11::string::~string((string *)&right_context_1);
            std::__cxx11::istringstream::~istringstream((istringstream *)&found);
            std::__cxx11::string::~string((string *)&ALT);
          } while( true );
        }
      }
      goto switchD_00106934_caseD_64;
    }
    std::__cxx11::string::string((string *)&ref_file,_optarg,(allocator *)&vcf_file);
    psVar25 = &vcf_path_abi_cxx11_;
  }
  std::__cxx11::string::operator=((string *)psVar25,(string *)&ref_file);
  std::__cxx11::string::~string((string *)&ref_file);
  goto LAB_00106918;
switchD_00106934_caseD_6c:
  rlength = atoi(_optarg);
  goto LAB_00106918;
}

Assistant:

int main(int argc, char** argv){

	if(argc < 4) help();

	int opt;
	while ((opt = getopt(argc, argv, "hv:c:f:l:k:")) != -1){
		switch (opt){
			case 'h':
				help();
			break;
			case 'v':
				vcf_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'c':
				calls_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'f':
				ref_path = string(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'l':
				rlength = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			case 'k':
				k_nonis = atoi(optarg);
				//cout << "input = " << input << "\n";
			break;
			default:
				help();
			return -1;
		}
	}

	rlength = rlength == 0 ? rlength_def : rlength;
	k_nonis = k_nonis == 0 ? k_nonis_def : k_nonis;

	if(vcf_path.compare("")==0 or calls_path.compare("")==0 or ref_path.compare("")==0) help();

	//reference indexed by contig: e.g. string chr1 = ref["chr1"]
	std::map<string,string> ref;

	cout << "Loading reference ... " << flush;

	/*
	 *
	 * READ REFERENCE, LOAD CONTIGS IN MEMORY
	 *
	 */
	ifstream ref_file;
	ref_file.open(ref_path, ios::in);

	string line;
	string contig;

	vector<string> contigs;

	int nonisolated_snps=0;

	while(not ref_file.eof()){

		getline(ref_file, line);

		if(line[0] == '>'){//new contig name

			contig = line.substr(1);
			contigs.push_back(contig);

			ref[contig] = string();

		}else{

			for (auto & c: line) c = toupper(c);
			ref[contig].append(line);

		}

	}

	cout << "done." << endl;

	uint64_t N = 0;

	cout << "Contig\tlength" << endl;
	for(auto c : contigs){

		cout << c << "\t" << ref[c].length() << endl;

		N+=ref[c].length();

	}
	//cout << endl;

	ref_file.close();


	/*
	 * LOAD SNPS FROM VCF
	 */

	cout << "Loading VCF ... " << flush;

	uint64_t n_snps=0;//number of SNPs in the VCF

	//read vcf
	ifstream vcf_file;
	vcf_file.open(vcf_path, ios::in);

	vector<call> calls_vcf;
	uint64_t ID = 0;

	while(not vcf_file.eof()){

		getline(vcf_file, line);

		if(line.size()>0 and line[0] != '#'){

			std::istringstream is( line );

			string chr;
			int pos;
			string id;
			string REF;
			string ALT;

			is >> chr >> pos >> id >> REF >> ALT;

			pos--;//coordinates are 1-based in the vcf file

			//keep just SNPs
			if(		(REF.compare("A")==0 or REF.compare("C")==0 or REF.compare("T")==0 or REF.compare("G")==0) and
					(ALT.compare("A")==0 or ALT.compare("C")==0 or ALT.compare("T")==0 or ALT.compare("G")==0)
			){

				if(ref[chr].compare("")!=0){//if chromosome exists in the reference file

					n_snps++;

					//insert forward call

					if(pos >= ref[chr].size()){

						cout << "WARNING: position " << pos << " larger than chromosome " << chr << "'s length " << ref[chr].size() << endl;

					}

					if(pos >= rlength && pos+rlength < ref[chr].size()){

						assert(pos+1<ref[chr].size());
						assert(pos+1+rlength<=ref[chr].size());
						assert(pos>=rlength);
						assert(pos-rlength<ref[chr].size());
						assert(pos<=ref[chr].size());

						string right_context = ref[chr].substr(pos+1,rlength);
						string left_context = REV(ref[chr].substr(pos-rlength,rlength));

						assert(REF.size()>0);
						assert(ALT.size()>0);

						calls_vcf.push_back(call {right_context, left_context, REF[0], ALT[0], ID, true, pos});

						//insert RC call

						left_context = REV(RC(ref[chr].substr(pos+1,rlength)));
						right_context = RC(ref[chr].substr(pos-rlength,rlength));

						calls_vcf.push_back(call {right_context, left_context, RC(REF[0]), RC(ALT[0]), ID, true, pos});

					}

					++ID;

				}else{

					cout << "WARNING: chromosome " << chr << " not found. " << endl;

				}

			}

		}

	}


	if(calls_vcf.size()==0){

		cout << "WARNING: no variants found. Check that chromosome names are the same in the fasta and vcf files. " << endl;

	}

	for(int i=2;calls_vcf.size() > 1 && i<calls_vcf.size()-2;++i){

		if(i%2==0){

			calls_vcf[i].isolated = calls_vcf[i].pos - calls_vcf[i-2].pos >= k_nonis and calls_vcf[i+2].pos - calls_vcf[i].pos >= k_nonis;
			calls_vcf[i+1].isolated = calls_vcf[i].isolated;

			if(not calls_vcf[i].isolated){

				//cout << calls_vcf[i].pos - calls_vcf[i-2].pos << " " << calls_vcf[i+2].pos - calls_vcf[i].pos << endl;
				nonisolated_snps++;

			}

		}

	}

	cout << "done." << endl;

	cout << "Sorting VCF by context ... " << flush;
	std::sort(calls_vcf.begin(), calls_vcf.end(), comp);
	cout << "done." << endl;

	vcf_file.close();

	//vector<call> calls;

	/*
	 *
	 * LOAD CALLS FROM FASTA GENERATED BY SNP-CALLING TOOL, SEARCH THEM IN THE RANGE STRUCTURE OF
	 * CONTAINING VCF CALLS
	 *
	 */

	uint64_t n_calls = 0;//number of SNPs in input fasta file (including hidden SNPs inside the sequences)

	cout << "Checking calls ... " << flush;

	uint64_t FP = 0;
	uint64_t FN = 0;
	uint64_t TP = 0;
	uint64_t TN = 0;

	auto assigned = vector<int>(calls_vcf.size(),0);

	//read calls
	ifstream calls_file;
	calls_file.open(calls_path, ios::in);

	//left/right contexts per sample
	vector<string> left_contexts = vector<string>(2);
	string right_context;

	getline(calls_file, line);

	int last_id = 0;
	int non_isolated_SNPs = 0;

	while(not calls_file.eof()){

		//header of first read

		string h1=line;

		std::istringstream is( line );
		string pos;
		getline(is,pos,'|');

		if(pos.substr(0,4).compare(">SNP")==0){//filter out indels

			getline(is,pos,'|');

			is = istringstream(pos);
			getline(is,pos,':');
			getline(is,pos,':');

			is = istringstream(pos);
			getline(is,pos,'_');

			int ipos = atoi(pos.c_str());//position of leftmost SNP
			ipos = 0;

			string DNA1, DNA2;
			getline(calls_file, DNA1);//DNA of first read

			getline(calls_file, DNA2);//skip header of second read
			string h2=DNA2;

			getline(calls_file, DNA2);//DNA of second read

			//some consistency checks on the file

			/*if(DNA1.substr(DNA1.size() - ipos).compare(DNA2.substr(DNA2.size() - ipos)) != 0){

				cout << "Error: malformed SNP file. Last " << ipos << " bases do not coincide\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			if(DNA1.length()!=DNA2.length()){

				cout << "Error: malformed SNP file. Two reads with different length in a SNP:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}

			/*if(DNA1[DNA1.size()-ipos-1] == DNA2[DNA2.size()-ipos-1]){

				cout << "Error: malformed SNP file. No SNP at specified position:\n";
				cout << h1 << endl << DNA1 << endl << h2 << endl << DNA2 << endl;
				exit(1);

			}*/

			//search all SNPs from the leftmost backwards
			while(ipos<DNA1.size()){

				//if SNP found
				if(DNA1[DNA1.size()-ipos-1] != DNA2[DNA2.size()-ipos-1]){

					n_calls++;

					string right_context1 = DNA1.substr(DNA1.size()-ipos);
					string right_context2 = DNA2.substr(DNA2.size()-ipos);

					string left_context1 = REV(DNA1.substr(0, DNA1.size()-ipos-1));
					string left_context2 = REV(DNA2.substr(0, DNA2.size()-ipos-1));

					char REF = DNA1[DNA1.size()-ipos-1];
					char ALT = DNA2[DNA2.size()-ipos-1];

					call c1 = {right_context1, left_context1, REF, ALT, 0, false};
					call c2 = {right_context2, left_context2, REF, ALT, 0, false};

					non_isolated_SNPs++;

					//Search c1 in the range structure

					auto it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c1, comp);

					uint64_t idx = std::distance(calls_vcf.begin(), it);

					bool found = false;

					/*
					 * while right context of c1 prefixes right context in range of VCF calls
					 */

					while(idx < calls_vcf.size() and is_prefix(right_context1, calls_vcf[idx].right_context)){

						if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
							(is_prefix(left_context1, calls_vcf[idx].left_context))	){

							found = true;
							assigned[idx] = 1;

						}

						++idx;

					}

					if(not found){

						//Search c2 in the range structure

						it = lower_bound(calls_vcf.begin(), calls_vcf.end(),c2, comp);

						idx = std::distance(calls_vcf.begin(), it);

						/*
						 * while right context of c2 prefixes right context in range of VCF calls
						 */
						while(idx < calls_vcf.size() and is_prefix(right_context2, calls_vcf[idx].right_context)){

							if( ((calls_vcf[idx].ALT == ALT and calls_vcf[idx].REF == REF) or (calls_vcf[idx].ALT == REF and calls_vcf[idx].REF == ALT)) and
								(is_prefix(left_context2, calls_vcf[idx].left_context))	){

								found = true;
								assigned[idx] = 1;

							}

							++idx;

						}

					}

					if(not found) FP++;

				}

				++ipos;

			}

			non_isolated_SNPs--;

		}else{

			//skip event

			getline(calls_file, line);//DNA of first read
			getline(calls_file, line);//header of second read
			getline(calls_file, line);//DNA of second read

		}

		getline(calls_file, line);//header of first read

	}

	cout << "done." << endl;

	calls_file.close();



	vector<call> found_calls_vcf;//count how many SNPs in the VCF have been found

	std::set<int> found;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i]){

			found.insert(calls_vcf[i].ID);

		}

	}

	//nonisolated SNPs found
	std::set<int> found_nonisolated;

	for (uint64_t i = 0; i< calls_vcf.size();++i){

		if(assigned[i] and not calls_vcf[i].isolated){

			found_nonisolated.insert(calls_vcf[i].ID);

		}

	}

	TP = found.size();

	//number of true SNPs that are not found
	FN = n_snps - TP;

	//this is a lower bound because we may call multiple times the same SNP
	TN = (N - n_calls) -  FN;

	cout << endl << "Non-isolated SNPs detected: " << found_nonisolated.size()  << "/" << nonisolated_snps << endl;

	cout << endl;
	cout << "TP = " << TP << endl;
	cout << "TN = " << TN << endl;
	cout << "FP = " << FP << endl;
	cout << "FN = " << FN << endl;

	cout << "sensitivity = TP/(TP+FN) = " << 100*double(TP)/(double(TP)+double(FN)) << "%" << endl;
	cout << "specificity = TN/(TN+FP) = " << 100*double(TN)/(double(TN)+double(FP)) << "%" << endl;
	cout << "precision   = TP/(TP+FP) = " << 100*double(TP)/(double(TP)+double(FP)) << "%" << endl;



}